

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O3

void __thiscall trackerboy::apu::NoiseChannel::setNoise(NoiseChannel *this,uint8_t noisereg)

{
  byte bVar1;
  undefined3 in_register_00000031;
  
  (this->super_Channel).mFrequency = (uint16_t)CONCAT31(in_register_00000031,noisereg);
  bVar1 = 8;
  if ((noisereg & 7) != 0) {
    bVar1 = (noisereg & 7) << 4;
  }
  this->mHalfWidth = (bool)(noisereg >> 3 & 1);
  this->mValidScf = noisereg < 0xe0;
  (this->super_Channel).mTimer.mPeriod =
       (uint)bVar1 << ((byte)(CONCAT31(in_register_00000031,noisereg) >> 4) & 0x1f);
  return;
}

Assistant:

void NoiseChannel::setNoise(uint8_t noisereg) noexcept {
    mFrequency = noisereg;
    // drf = "dividing ratio frequency", divisor, etc
    uint8_t drf = mFrequency & 0x7;
    if (drf == 0) {
        drf = 8;
    } else {
        drf *= 16;
    }
    mHalfWidth = !!((mFrequency >> 3) & 1);
    // scf = "shift clock frequency"
    auto scf = mFrequency >> 4;
    mValidScf = scf < 0xE; // obscure behavior: a scf of 14 or 15 results in the channel receiving no clocks
    timer().setPeriod(drf << scf);
}